

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_ref_t art_find_child(art_inner_node_t *node,art_typecode_t typecode,art_key_chunk_t key_chunk)

{
  art_key_chunk_t in_DL;
  undefined1 in_SIL;
  art_node256_t *in_RDI;
  art_ref_t local_8;
  
  switch(in_SIL) {
  case 2:
    local_8 = art_node4_find_child((art_node4_t *)in_RDI,in_DL);
    break;
  case 3:
    local_8 = art_node16_find_child((art_node16_t *)in_RDI,in_DL);
    break;
  case 4:
    local_8 = art_node48_find_child((art_node48_t *)in_RDI,in_DL);
    break;
  case 5:
    local_8 = art_node256_find_child(in_RDI,in_DL);
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static art_ref_t art_find_child(const art_inner_node_t *node,
                                art_typecode_t typecode,
                                art_key_chunk_t key_chunk) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            return art_node4_find_child((art_node4_t *)node, key_chunk);
        case CROARING_ART_NODE16_TYPE:
            return art_node16_find_child((art_node16_t *)node, key_chunk);
        case CROARING_ART_NODE48_TYPE:
            return art_node48_find_child((art_node48_t *)node, key_chunk);
        case CROARING_ART_NODE256_TYPE:
            return art_node256_find_child((art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return CROARING_ART_NULL_REF;
    }
}